

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.h
# Opt level: O2

void MeCab::uitoa<unsigned_short>(unsigned_short val,char *s)

{
  char *t;
  long lVar1;
  char *pcVar2;
  
  lVar1 = 0;
  for (; val != 0; val = val / 10) {
    s[lVar1] = (byte)(val % 10) | 0x30;
    lVar1 = lVar1 + 1;
  }
  if (lVar1 == 0) {
    pcVar2 = s + 1;
    *s = '0';
  }
  else {
    pcVar2 = s + lVar1;
  }
  *pcVar2 = '\0';
  std::__reverse<char*>(s);
  return;
}

Assistant:

inline void uitoa(T val, char *s) {
  char *t;
  T mod;
  t = s;
  while (val) {
    mod = val % 10;
    *t++ = static_cast<char>(mod) + '0';
    val /= 10;
  }

  if (s == t) *t++ = '0';
  *t = '\0';
  std::reverse(s, t);
  return;
}